

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# StdPluginLib.h
# Opt level: O2

shared_ptr<NumberGeneratorImpl> __thiscall
plugin::StdPluginLib::AddExtension<NumberGeneratorImpl>(StdPluginLib *this)

{
  NumberGeneratorImpl *this_00;
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  long in_RSI;
  shared_ptr<NumberGeneratorImpl> sVar1;
  shared_ptr<plugin::interfaces::IPluginInterface> sStack_28;
  
  this_00 = (NumberGeneratorImpl *)operator_new(8);
  NumberGeneratorImpl::NumberGeneratorImpl(this_00);
  std::__shared_ptr<NumberGeneratorImpl,(__gnu_cxx::_Lock_policy)2>::
  __shared_ptr<NumberGeneratorImpl,void>
            ((__shared_ptr<NumberGeneratorImpl,(__gnu_cxx::_Lock_policy)2> *)this,this_00);
  std::__shared_ptr<plugin::interfaces::IPluginInterface,(__gnu_cxx::_Lock_policy)2>::
  __shared_ptr<NumberGeneratorImpl,void>
            ((__shared_ptr<plugin::interfaces::IPluginInterface,(__gnu_cxx::_Lock_policy)2> *)
             &sStack_28,(__shared_ptr<NumberGeneratorImpl,_(__gnu_cxx::_Lock_policy)2> *)this);
  std::
  vector<std::shared_ptr<plugin::interfaces::IPluginInterface>,std::allocator<std::shared_ptr<plugin::interfaces::IPluginInterface>>>
  ::emplace_back<std::shared_ptr<plugin::interfaces::IPluginInterface>>
            ((vector<std::shared_ptr<plugin::interfaces::IPluginInterface>,std::allocator<std::shared_ptr<plugin::interfaces::IPluginInterface>>>
              *)(in_RSI + 8),&sStack_28);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&sStack_28.
              super___shared_ptr<plugin::interfaces::IPluginInterface,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount);
  sVar1.super___shared_ptr<NumberGeneratorImpl,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       extraout_RDX._M_pi;
  sVar1.super___shared_ptr<NumberGeneratorImpl,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)this;
  return (shared_ptr<NumberGeneratorImpl>)
         sVar1.super___shared_ptr<NumberGeneratorImpl,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

std::shared_ptr<IFACEIMPL> AddExtension()
        {
            // Using operator new instead of std::make_shared because
            // interface instances have private constructors, and a friend
            // relationship to allow this function to construct them.
            std::shared_ptr<IFACEIMPL> const instance { new IFACEIMPL };
            m_extensions.push_back(instance);
            return instance;
       }